

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

CURLcode Curl_mime_prepare_headers
                   (curl_mimepart *part,char *contenttype,char *disposition,mimestrategy strategy)

{
  curl_slist **slp;
  curl_slist *pcVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  CURLcode CVar5;
  int iVar6;
  CURLcode CVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  curl_mimepart *part_00;
  void *local_50;
  char *local_40;
  
  curl_slist_free_all(part->curlheaders);
  part->curlheaders = (curl_slist *)0x0;
  if ((part->state).state == MIMESTATE_CURLHEADERS) {
    (part->state).state = MIMESTATE_CURLHEADERS;
    (part->state).ptr = (void *)0x0;
    (part->state).offset = 0;
  }
  pcVar8 = part->mimetype;
  if (pcVar8 == (char *)0x0) {
    pcVar8 = search_header(part->userheaders,"Content-Type");
  }
  if (pcVar8 != (char *)0x0) {
    contenttype = pcVar8;
  }
  if (contenttype == (char *)0x0) {
    if (part->kind == MIMEKIND_MULTIPART) {
      contenttype = "multipart/mixed";
    }
    else if (part->kind == MIMEKIND_FILE) {
      contenttype = Curl_mime_contenttype(part->filename);
      if (contenttype == (char *)0x0) {
        contenttype = Curl_mime_contenttype(part->data);
      }
      if ((contenttype == (char *)0x0) &&
         (contenttype = "application/octet-stream", part->filename == (char *)0x0)) {
        contenttype = (char *)0x0;
      }
    }
    else {
      contenttype = Curl_mime_contenttype(part->filename);
    }
  }
  if (part->kind == MIMEKIND_MULTIPART) {
    local_50 = part->arg;
    if (local_50 == (void *)0x0) goto LAB_00441fa6;
    pcVar8 = *(char **)((long)local_50 + 0x20);
  }
  else {
    if ((((pcVar8 == (char *)0x0) && (contenttype != (char *)0x0)) &&
        (iVar6 = Curl_strcasecompare(contenttype,"text/plain"), iVar6 != 0)) &&
       ((strategy == MIMESTRATEGY_MAIL || (part->filename == (char *)0x0)))) {
      contenttype = (char *)0x0;
    }
LAB_00441fa6:
    local_50 = (void *)0x0;
    pcVar8 = (char *)0x0;
  }
  slp = &part->curlheaders;
  pcVar9 = search_header(part->userheaders,"Content-Disposition");
  CVar7 = CURLE_OK;
  if (pcVar9 != (char *)0x0) goto LAB_00441fd1;
  if (disposition == (char *)0x0) {
    if (((part->filename == (char *)0x0) && (part->name == (char *)0x0)) &&
       ((contenttype == (char *)0x0 ||
        (iVar6 = Curl_strncasecompare(contenttype,"multipart/",10), iVar6 != 0)))) {
      disposition = (char *)0x0;
    }
    else {
      disposition = "attachment";
    }
  }
  CVar7 = CURLE_OK;
  if (disposition == (char *)0x0) {
    disposition = (char *)0x0;
  }
  else {
    iVar6 = curl_strequal(disposition,"attachment");
    if (((iVar6 != 0) && (part->name == (char *)0x0)) && (part->filename == (char *)0x0)) {
      disposition = (char *)0x0;
    }
  }
  if (disposition == (char *)0x0) goto LAB_00441fd1;
  CVar7 = CURLE_OK;
  bVar2 = true;
  if (part->name == (char *)0x0) {
LAB_004421bb:
    pcVar9 = (char *)0x0;
  }
  else {
    pcVar9 = escape_string(part->name);
    if (pcVar9 == (char *)0x0) {
      CVar7 = CURLE_OUT_OF_MEMORY;
      bVar2 = false;
      goto LAB_004421bb;
    }
  }
  local_40 = (char *)0x0;
  if (bVar2) {
    if (part->filename == (char *)0x0) {
      CVar7 = CURLE_OK;
    }
    else {
      local_40 = escape_string(part->filename);
      CVar7 = CURLE_OUT_OF_MEMORY;
      if (local_40 != (char *)0x0) {
        CVar7 = CURLE_OK;
      }
    }
  }
  if (CVar7 == CURLE_OK) {
    pcVar10 = "; name=\"";
    pcVar12 = pcVar9;
    if (pcVar9 == (char *)0x0) {
      pcVar10 = "";
      pcVar12 = "";
    }
    pcVar3 = "\n\t\t\t\"";
    pcVar4 = "\n\t\t\t\"";
    if (pcVar9 == (char *)0x0) {
      pcVar4 = "PK\x01\x02";
    }
    pcVar13 = "; filename=\"";
    pcVar11 = local_40;
    if (local_40 == (char *)0x0) {
      pcVar13 = "";
      pcVar11 = "";
      pcVar3 = "PK\x01\x02";
    }
    CVar7 = Curl_mime_add_header
                      (slp,"Content-Disposition: %s%s%s%s%s%s%s",disposition,pcVar10,pcVar12,
                       pcVar4 + 4,pcVar13,pcVar11,pcVar3 + 4);
  }
  (*Curl_cfree)(pcVar9);
  (*Curl_cfree)(local_40);
  if (CVar7 != CURLE_OK) {
    return CVar7;
  }
LAB_00441fd1:
  if (contenttype != (char *)0x0) {
    pcVar9 = "; boundary=";
    if (pcVar8 == (char *)0x0) {
      pcVar9 = "";
      pcVar8 = "";
    }
    CVar7 = CURLE_OK;
    CVar5 = Curl_mime_add_header(slp,"Content-Type: %s%s%s",contenttype,pcVar9,pcVar8);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
  }
  pcVar8 = search_header(part->userheaders,"Content-Transfer-Encoding");
  if (pcVar8 == (char *)0x0) {
    if (part->encoder == (mime_encoder *)0x0) {
      pcVar8 = (char *)0x0;
      if (((strategy == MIMESTRATEGY_MAIL) && (contenttype != (char *)0x0)) &&
         (pcVar8 = (char *)0x0, part->kind != MIMEKIND_MULTIPART)) {
        pcVar8 = "8bit";
      }
    }
    else {
      pcVar8 = part->encoder->name;
    }
    if (pcVar8 != (char *)0x0) {
      CVar7 = CURLE_OK;
      CVar5 = Curl_mime_add_header(slp,"Content-Transfer-Encoding: %s");
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
    }
  }
  if ((part->state).state == MIMESTATE_CURLHEADERS) {
    pcVar1 = part->curlheaders;
    (part->state).state = MIMESTATE_CURLHEADERS;
    (part->state).ptr = pcVar1;
    (part->state).offset = 0;
  }
  if ((local_50 != (void *)0x0) && (part->kind == MIMEKIND_MULTIPART)) {
    iVar6 = Curl_strcasecompare(contenttype,"multipart/form-data");
    pcVar8 = (char *)0x0;
    if (iVar6 != 0) {
      pcVar8 = "form-data";
    }
    part_00 = *(curl_mimepart **)((long)local_50 + 0x10);
    if (part_00 != (curl_mimepart *)0x0) {
      do {
        CVar7 = Curl_mime_prepare_headers(part_00,(char *)0x0,pcVar8,strategy);
        if (CVar7 != CURLE_OK) {
          return CVar7;
        }
        part_00 = part_00->nextpart;
      } while (part_00 != (curl_mimepart *)0x0);
      CVar7 = CURLE_OK;
    }
  }
  return CVar7;
}

Assistant:

CURLcode Curl_mime_prepare_headers(curl_mimepart *part,
                                   const char *contenttype,
                                   const char *disposition,
                                   enum mimestrategy strategy)
{
  curl_mime *mime = NULL;
  const char *boundary = NULL;
  char *customct;
  const char *cte = NULL;
  CURLcode ret = CURLE_OK;

  /* Get rid of previously prepared headers. */
  curl_slist_free_all(part->curlheaders);
  part->curlheaders = NULL;

  /* Be sure we won't access old headers later. */
  if(part->state.state == MIMESTATE_CURLHEADERS)
    mimesetstate(&part->state, MIMESTATE_CURLHEADERS, NULL);

  /* Check if content type is specified. */
  customct = part->mimetype;
  if(!customct)
    customct = search_header(part->userheaders, "Content-Type");
  if(customct)
    contenttype = customct;

  /* If content type is not specified, try to determine it. */
  if(!contenttype) {
    switch(part->kind) {
    case MIMEKIND_MULTIPART:
      contenttype = MULTIPART_CONTENTTYPE_DEFAULT;
      break;
    case MIMEKIND_FILE:
      contenttype = Curl_mime_contenttype(part->filename);
      if(!contenttype)
        contenttype = Curl_mime_contenttype(part->data);
      if(!contenttype && part->filename)
        contenttype = FILE_CONTENTTYPE_DEFAULT;
      break;
    default:
      contenttype = Curl_mime_contenttype(part->filename);
      break;
    }
  }

  if(part->kind == MIMEKIND_MULTIPART) {
    mime = (curl_mime *) part->arg;
    if(mime)
      boundary = mime->boundary;
  }
  else if(contenttype && !customct &&
          strcasecompare(contenttype, "text/plain"))
    if(strategy == MIMESTRATEGY_MAIL || !part->filename)
      contenttype = NULL;

  /* Issue content-disposition header only if not already set by caller. */
  if(!search_header(part->userheaders, "Content-Disposition")) {
    if(!disposition)
      if(part->filename || part->name ||
        (contenttype && !strncasecompare(contenttype, "multipart/", 10)))
          disposition = DISPOSITION_DEFAULT;
    if(disposition && curl_strequal(disposition, "attachment") &&
     !part->name && !part->filename)
      disposition = NULL;
    if(disposition) {
      char *name = NULL;
      char *filename = NULL;

      if(part->name) {
        name = escape_string(part->name);
        if(!name)
          ret = CURLE_OUT_OF_MEMORY;
      }
      if(!ret && part->filename) {
        filename = escape_string(part->filename);
        if(!filename)
          ret = CURLE_OUT_OF_MEMORY;
      }
      if(!ret)
        ret = Curl_mime_add_header(&part->curlheaders,
                                   "Content-Disposition: %s%s%s%s%s%s%s",
                                   disposition,
                                   name? "; name=\"": "",
                                   name? name: "",
                                   name? "\"": "",
                                   filename? "; filename=\"": "",
                                   filename? filename: "",
                                   filename? "\"": "");
      Curl_safefree(name);
      Curl_safefree(filename);
      if(ret)
        return ret;
      }
    }

  /* Issue Content-Type header. */
  if(contenttype) {
    ret = add_content_type(&part->curlheaders, contenttype, boundary);
    if(ret)
      return ret;
  }

  /* Content-Transfer-Encoding header. */
  if(!search_header(part->userheaders, "Content-Transfer-Encoding")) {
    if(part->encoder)
      cte = part->encoder->name;
    else if(contenttype && strategy == MIMESTRATEGY_MAIL &&
     part->kind != MIMEKIND_MULTIPART)
      cte = "8bit";
    if(cte) {
      ret = Curl_mime_add_header(&part->curlheaders,
                                 "Content-Transfer-Encoding: %s", cte);
      if(ret)
        return ret;
    }
  }

  /* If we were reading curl-generated headers, restart with new ones (this
     should not occur). */
  if(part->state.state == MIMESTATE_CURLHEADERS)
    mimesetstate(&part->state, MIMESTATE_CURLHEADERS, part->curlheaders);

  /* Process subparts. */
  if(part->kind == MIMEKIND_MULTIPART && mime) {
    curl_mimepart *subpart;

    disposition = NULL;
    if(strcasecompare(contenttype, "multipart/form-data"))
      disposition = "form-data";
    for(subpart = mime->firstpart; subpart; subpart = subpart->nextpart) {
      ret = Curl_mime_prepare_headers(subpart, NULL, disposition, strategy);
      if(ret)
        return ret;
    }
  }
  return ret;
}